

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agentf.c
# Opt level: O0

void agentf_try_forward(agentf *af)

{
  uint32_t uVar1;
  size_t sVar2;
  ulong len;
  void *data;
  agent_pending_query *paVar3;
  int local_3c;
  void *pvStack_38;
  int replylen;
  void *reply;
  strbuf *psStack_28;
  uchar msglen [4];
  strbuf *message;
  size_t length;
  size_t datalen;
  agentf *af_local;
  
  if ((af->pending == (agent_pending_query *)0x0) && ((af->input_wanted & 1U) != 0)) {
    while (sVar2 = bufchain_size(&af->inbuffer), 3 < sVar2) {
      bufchain_fetch(&af->inbuffer,(void *)((long)&reply + 4),4);
      uVar1 = GET_32BIT_MSB_FIRST((void *)((long)&reply + 4));
      len = (ulong)uVar1;
      if (0x3fffc < len) {
        agentf_got_response(af,(void *)0x0,0);
        sshfwd_write_eof(af->c);
        return;
      }
      if (sVar2 - 4 < len) break;
      bufchain_consume(&af->inbuffer,4);
      psStack_28 = strbuf_new_for_agent_query();
      data = strbuf_append(psStack_28,len);
      bufchain_fetch_consume(&af->inbuffer,data,len);
      paVar3 = agent_query(psStack_28,&stack0xffffffffffffffc8,&local_3c,agentf_callback,af);
      af->pending = paVar3;
      strbuf_free(psStack_28);
      if (af->pending != (agent_pending_query *)0x0) {
        return;
      }
      agentf_got_response(af,pvStack_38,local_3c);
      safefree(pvStack_38);
    }
    if ((af->rcvd_eof & 1U) != 0) {
      sshfwd_write_eof(af->c);
    }
  }
  return;
}

Assistant:

static void agentf_try_forward(agentf *af)
{
    size_t datalen, length;
    strbuf *message;
    unsigned char msglen[4];
    void *reply;
    int replylen;

    /*
     * Don't try to parallelise agent requests. Wait for each one to
     * return before attempting the next.
     */
    if (af->pending)
        return;

    /*
     * If the outgoing side of the channel connection is currently
     * throttled, don't submit any new forwarded requests to the real
     * agent. This causes the input side of the agent forwarding not
     * to be emptied, exerting the required back-pressure on the
     * remote client, and encouraging it to read our responses before
     * sending too many more requests.
     */
    if (!af->input_wanted)
        return;

    while (1) {
        /*
         * Try to extract a complete message from the input buffer.
         */
        datalen = bufchain_size(&af->inbuffer);
        if (datalen < 4)
            break;         /* not even a length field available yet */

        bufchain_fetch(&af->inbuffer, msglen, 4);
        length = GET_32BIT_MSB_FIRST(msglen);

        if (length > AGENT_MAX_MSGLEN-4) {
            /*
             * If the remote has sent a message that's just _too_
             * long, we should reject it in advance of seeing the rest
             * of the incoming message, and also close the connection
             * for good measure (which avoids us having to faff about
             * with carefully ignoring just the right number of bytes
             * from the overlong message).
             */
            agentf_got_response(af, NULL, 0);
            sshfwd_write_eof(af->c);
            return;
        }

        if (length > datalen - 4)
            break;          /* a whole message is not yet available */

        bufchain_consume(&af->inbuffer, 4);

        message = strbuf_new_for_agent_query();
        bufchain_fetch_consume(
            &af->inbuffer, strbuf_append(message, length), length);
        af->pending = agent_query(
            message, &reply, &replylen, agentf_callback, af);
        strbuf_free(message);

        if (af->pending)
            return;   /* agent_query promised to reply in due course */

        /*
         * If the agent gave us an answer immediately, pass it
         * straight on and go round this loop again.
         */
        agentf_got_response(af, reply, replylen);
        sfree(reply);
    }

    /*
     * If we get here (i.e. we left the above while loop via 'break'
     * rather than 'return'), that means we've determined that the
     * input buffer for the agent forwarding connection doesn't
     * contain a complete request.
     *
     * So if there's potentially more data to come, we can return now,
     * and wait for the remote client to send it. But if the remote
     * has sent EOF, it would be a mistake to do that, because we'd be
     * waiting a long time. So this is the moment to check for EOF,
     * and respond appropriately.
     */
    if (af->rcvd_eof)
        sshfwd_write_eof(af->c);
}